

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O0

void __thiscall
FileReceiveSession::create_session_factory(boost::filesystem::path)::$_0::__0
          (__0 *this,anon_class_32_1_6ca262cf *param_1)

{
  anon_class_32_1_6ca262cf *param_1_local;
  anon_class_32_1_6ca262cf *this_local;
  
  boost::filesystem::path::path((path *)this,&param_1->target);
  return;
}

Assistant:

TCPServer::SessionFactory FileReceiveSession::create_session_factory(boost::filesystem::path target) {
  return [=](Poll &p, TCPServer &server, sockaddr_in ad) -> std::shared_ptr<Subscriber> {
    p.unsubscribe(server);
    auto s = std::make_shared<FileReceiveSession>(target);
    s->when_error([](auto p) { std::cout << "Error in receiving file " << p << std::endl; });
    s->when_sucess([](auto p) { std::cout << "Received file " << p << std::endl; });
    return s;
  };
}